

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_reader.hpp
# Opt level: O2

long duckdb::DecimalParquetValueConversion<long,_false>::PlainRead<false>
               (ByteBuffer *plain_data,ColumnReader *reader)

{
  uint uVar1;
  long lVar2;
  ulong req_len;
  
  uVar1 = ByteBuffer::read<unsigned_int>(plain_data);
  req_len = (ulong)uVar1;
  ByteBuffer::available(plain_data,req_len);
  lVar2 = ParquetDecimalUtils::ReadDecimalValue<long>(plain_data->ptr,req_len,reader->column_schema)
  ;
  ByteBuffer::inc(plain_data,req_len);
  return lVar2;
}

Assistant:

static DUCKDB_PHYSICAL_TYPE PlainRead(ByteBuffer &plain_data, ColumnReader &reader) {
		idx_t byte_len;
		if (FIXED_LENGTH) {
			byte_len = reader.Schema().type_length;
		} else {
			byte_len = plain_data.read<uint32_t>();
		}
		plain_data.available(byte_len);
		auto res = ParquetDecimalUtils::ReadDecimalValue<DUCKDB_PHYSICAL_TYPE>(const_data_ptr_cast(plain_data.ptr),
		                                                                       byte_len, reader.Schema());

		plain_data.inc(byte_len);
		return res;
	}